

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

error convert_integer(token *token,int64_t min,int64_t max,uint64_t *result)

{
  long lVar1;
  bool bVar2;
  long *in_R8;
  int64_t value;
  uint64_t *result_local;
  int64_t max_local;
  int64_t min_local;
  token *token_local;
  error *tmpres___LINE__;
  
  confirm_type(token,(token_type)min);
  bVar2 = error::operator_cast_to_bool((error *)token);
  if (!bVar2) {
    error::~error((error *)token);
    lVar1 = *(long *)(min + 8);
    if ((lVar1 < max) || ((long)result < lVar1)) {
      fail(token,(char *)min,
           "integer \x1b[1m%d\x1b[0m is out of range, expected to be from %ld to %ld inclusively",
           lVar1,max,result);
    }
    else {
      *in_R8 = lVar1;
      memset(token,0,8);
      error::error((error *)token);
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)token;
}

Assistant:

error convert_integer(const token& token, int64_t min, int64_t max, uint64_t* result)
{
    CHECK(confirm_type(token, token_type::immediate));

    int64_t value = token.data.immediate;
    if (value < min || value > max) {
        return fail(token,
                    "integer \33[1m%d\33[0m is out of range, expected to be "
                    "from %" PRId64 " to %" PRId64 " inclusively",
                    value, min, max);
    }
    *result = static_cast<uint64_t>(value);
    return {};
}